

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

bool __thiscall CUI::DoPickerLogic(CUI *this,void *pID,CUIRect *pRect,float *pX,float *pY)

{
  bool bVar1;
  void *pvVar2;
  CUIRect *in_RCX;
  CUI *in_RDX;
  void *in_RSI;
  CUI *in_RDI;
  float *in_R8;
  float fVar3;
  bool local_1;
  
  bVar1 = CheckActiveItem(in_RDI,in_RSI);
  if (bVar1) {
    bVar1 = MouseButton(in_RDI,0);
    if (!bVar1) {
      SetActiveItem(in_RDI,(void *)0x0);
    }
  }
  else {
    pvVar2 = HotItem(in_RDI);
    if ((pvVar2 == in_RSI) && (bVar1 = MouseButton(in_RDI,0), bVar1)) {
      SetActiveItem(in_RDI,in_RSI);
    }
  }
  bVar1 = MouseHovered(in_RDX,in_RCX);
  if (bVar1) {
    SetHotItem(in_RDI,in_RSI);
  }
  bVar1 = CheckActiveItem(in_RDI,in_RSI);
  if (bVar1) {
    if (in_RCX != (CUIRect *)0x0) {
      fVar3 = clamp<float>(in_RDI->m_MouseX - *(float *)in_RDX,0.0,*(float *)&in_RDX->m_pHotItem);
      in_RCX->x = fVar3;
    }
    if (in_R8 != (float *)0x0) {
      fVar3 = clamp<float>(in_RDI->m_MouseY - *(float *)&in_RDX->field_0x4,0.0,
                           *(float *)((long)&in_RDX->m_pHotItem + 4));
      *in_R8 = fVar3;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CUI::DoPickerLogic(const void *pID, const CUIRect *pRect, float *pX, float *pY)
{
	if(CheckActiveItem(pID))
	{
		if(!MouseButton(0))
			SetActiveItem(0);
	}
	else if(HotItem() == pID)
	{
		if(MouseButton(0))
			SetActiveItem(pID);
	}

	if(MouseHovered(pRect))
		SetHotItem(pID);

	if(!CheckActiveItem(pID))
		return false;

	if(pX)
		*pX = clamp(m_MouseX - pRect->x, 0.0f, pRect->w);
	if(pY)
		*pY = clamp(m_MouseY - pRect->y, 0.0f, pRect->h);

	return true;
}